

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall UnifiedRegex::CharSetInner::FreeSelf(CharSetInner *this,ArenaAllocator *allocator)

{
  uint local_1c;
  uint i;
  ArenaAllocator *allocator_local;
  CharSetInner *this_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    if (this->children[local_1c] != (CharSetNode *)0x0) {
      (**this->children[local_1c]->_vptr_CharSetNode)(this->children[local_1c],allocator);
      this->children[local_1c] = (CharSetNode *)0x0;
    }
  }
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::CharSetInner>
            (allocator,this);
  return;
}

Assistant:

void CharSetInner::FreeSelf(ArenaAllocator* allocator)
    {
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != 0)
            {
                children[i]->FreeSelf(allocator);
#if DBG
                children[i] = 0;
#endif
            }
        }
        Adelete(allocator, this);
    }